

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_cform.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_cform::xr_level_cform(xr_level_cform *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_cform *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_cform *this_local;
  
  s = r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  xr_cform::xr_cform(&this->super_xr_cform);
  (this->super_xr_cform)._vptr_xr_cform = (_func_int **)&PTR__xr_level_cform_0038c8d8;
  local_28 = (xr_reader *)0x0;
  if (r_local._4_4_ == 5) {
    local_28 = xr_reader::open_chunk(s,6);
  }
  else if ((r_local._4_4_ == 8) || (r_local._4_4_ == 9)) {
    local_28 = xr_reader::open_chunk(s,5);
  }
  if (local_28 == (xr_reader *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_cform.cxx"
                  ,0xe,"xray_re::xr_level_cform::xr_level_cform(uint32_t, xr_reader &)");
  }
  xr_cform::load(&this->super_xr_cform,local_28);
  xr_reader::close_chunk(s,&local_28);
  return;
}

Assistant:

xr_level_cform::xr_level_cform(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5)
		s = r.open_chunk(FSL5_CFORM);
	else if (xrlc_version == XRLC_VERSION_8 || xrlc_version == XRLC_VERSION_9)
		s = r.open_chunk(FSL8_CFORM);
	xr_assert(s);
	xr_cform::load(*s);
	r.close_chunk(s);
}